

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O3

void __thiscall cppcms::session_interface::default_expiration(session_interface *this)

{
  string local_38;
  
  check(this);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"_h","");
  erase(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  this->how_ = this->how_def_;
  return;
}

Assistant:

void session_interface::default_expiration()
{
	check();
	erase("_h");
	how_=how_def_;
}